

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdCelsiusVtxbufFormat::is_valid_val(MthdCelsiusVtxbufFormat *this)

{
  uint uVar1;
  int comp;
  MthdCelsiusVtxbufFormat *this_local;
  
  if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 == 0) {
    uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x39) >> 0x3d);
    if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x27) < 0) {
      if (uVar1 == 2) {
        return false;
      }
    }
    else if (uVar1 == 4) {
      return false;
    }
  }
  return true;
}

Assistant:

bool is_valid_val() override {
		if (idx == 0) {
			int comp = extr(val, 4, 3);
			if (!extr(val, 24, 1)) {
				if (comp == 4)
					return false;
			} else {
				if (comp == 2)
					return false;
			}
		}
		return true;
	}